

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::anon_unknown_15::ConsoleReporter::log_contexts(ConsoleReporter *this)

{
  ostream *s;
  uint uVar1;
  IContextScope **ppIVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = IReporter::get_num_active_contexts();
  if (uVar1 != 0) {
    ppIVar2 = IReporter::get_active_contexts();
    s = this->s;
    uVar4 = 0;
    Color::operator<<(s,None);
    std::operator<<(s,"  logged: ");
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar4;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pcVar3 = "          ";
      if (uVar4 == 0) {
        pcVar3 = "";
      }
      std::operator<<(this->s,pcVar3);
      (*ppIVar2[uVar4]->_vptr_IContextScope[2])(ppIVar2[uVar4],this->s);
      std::operator<<(this->s,"\n");
    }
  }
  std::operator<<(this->s,"\n");
  return;
}

Assistant:

void log_contexts() {
            int num_contexts = get_num_active_contexts();
            if(num_contexts) {
                auto contexts = get_active_contexts();

                s << Color::None << "  logged: ";
                for(int i = 0; i < num_contexts; ++i) {
                    s << (i == 0 ? "" : "          ");
                    contexts[i]->stringify(&s);
                    s << "\n";
                }
            }

            s << "\n";
        }